

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O1

DdNode * Llb_ManConstructOutBdd(Aig_Man_t *pAig,Aig_Obj_t *pNode,DdManager *dd)

{
  abctime aVar1;
  void *pvVar2;
  Vec_Ptr_t *__ptr;
  DdNode *pDVar3;
  long lVar4;
  Aig_Obj_t *local_30;
  
  local_30 = pNode;
  if (pAig->pConst1 == (Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe)) {
    pDVar3 = Cudd_ReadOne(dd);
    pDVar3 = (DdNode *)((ulong)((uint)local_30->pFanin0 & 1) ^ (ulong)pDVar3);
  }
  else {
    aVar1 = dd->TimeStop;
    dd->TimeStop = 0;
    __ptr = Aig_ManDfsNodes(pAig,&local_30,1);
    if (__ptr->nSize < 1) {
      __assert_fail("Vec_PtrSize(vNodes) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                    ,0x38,"DdNode *Llb_ManConstructOutBdd(Aig_Man_t *, Aig_Obj_t *, DdManager *)");
    }
    lVar4 = 0;
    do {
      pvVar2 = __ptr->pArray[lVar4];
      if (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7) {
        pDVar3 = Cudd_bddAnd(dd,(DdNode *)
                                ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                                *(ulong *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                          0x28)),
                             (DdNode *)
                             ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                             *(ulong *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) +
                                       0x28)));
        *(DdNode **)((long)pvVar2 + 0x28) = pDVar3;
        Cudd_Ref(pDVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < __ptr->nSize);
    pDVar3 = *(DdNode **)((long)pvVar2 + 0x28);
    Cudd_Ref(pDVar3);
    if (0 < __ptr->nSize) {
      lVar4 = 0;
      do {
        if (0xfffffffd < (*(uint *)((long)__ptr->pArray[lVar4] + 0x18) & 7) - 7) {
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)__ptr->pArray[lVar4] + 0x28));
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    if (__ptr != (Vec_Ptr_t *)0x0) {
      free(__ptr);
    }
    if ((*(uint *)&local_30->field_0x18 & 7) == 3) {
      pDVar3 = (DdNode *)((ulong)pDVar3 ^ (ulong)((uint)local_30->pFanin0 & 1));
    }
    Cudd_Deref(pDVar3);
    dd->TimeStop = aVar1;
  }
  return pDVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START

 
////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives global BDD for the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
DdNode * Llb_ManConstructOutBdd( Aig_Man_t * pAig, Aig_Obj_t * pNode, DdManager * dd )
{
    DdNode * bBdd0, * bBdd1, * bFunc;
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj = NULL;
    int i;
    abctime TimeStop;
    if ( Aig_ObjFanin0(pNode) == Aig_ManConst1(pAig) )
        return Cudd_NotCond( Cudd_ReadOne(dd), Aig_ObjFaninC0(pNode) );
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    vNodes = Aig_ManDfsNodes( pAig, &pNode, 1 );
    assert( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        bBdd0 = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );  Cudd_Ref( (DdNode *)pObj->pData );
    }
    bFunc = (DdNode *)pObj->pData; Cudd_Ref( bFunc );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    }
    Vec_PtrFree( vNodes );
    if ( Aig_ObjIsCo(pNode) )
        bFunc = Cudd_NotCond( bFunc, Aig_ObjFaninC0(pNode) );
    Cudd_Deref( bFunc );
    dd->TimeStop = TimeStop;
    return bFunc;
}